

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

spv_result_t spvtools::val::anon_unknown_2::ValidateStore(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  AddressingModel AVar3;
  Op OVar4;
  int32_t iVar5;
  uint32_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  Feature *pFVar9;
  DiagnosticStream *pDVar10;
  Function *pFVar11;
  spv_const_context psVar12;
  spv_const_validator_options psVar13;
  DiagnosticStream local_1880;
  spv_result_t local_16a4;
  undefined1 local_16a0 [4];
  spv_result_t error;
  string local_1680;
  DiagnosticStream local_1660;
  string local_1488;
  string local_1468;
  DiagnosticStream local_1448;
  string local_1270;
  DiagnosticStream local_1250;
  Instruction *local_1078;
  Instruction *object_type;
  DiagnosticStream local_1050;
  Instruction *local_e78;
  Instruction *object;
  uint object_id;
  int object_index;
  DiagnosticStream local_e48;
  Instruction *local_c70;
  Instruction *base_type;
  Instruction *base_ptr;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_c40;
  undefined1 local_c20 [8];
  string errorVUID;
  string local_a28;
  DiagnosticStream local_a08;
  string local_830;
  DiagnosticStream local_810;
  StorageClass local_638;
  uint32_t local_634;
  StorageClass storage_class;
  uint32_t data_type;
  DiagnosticStream local_610;
  uint local_434;
  Instruction *pIStack_430;
  uint type_id;
  Instruction *type;
  DiagnosticStream local_408;
  Instruction *local_230;
  Instruction *pointer_type;
  DiagnosticStream local_208;
  Instruction *local_30;
  Instruction *pointer;
  uint pointer_id;
  int pointer_index;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pointer._4_4_ = 0;
  _pointer_id = inst;
  inst_local = (Instruction *)_;
  pointer._0_4_ = Instruction::GetOperandAs<unsigned_int>(inst,0);
  local_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,(uint)pointer);
  if (local_30 == (Instruction *)0x0) {
LAB_005824a2:
    ValidationState_t::diag
              (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_pointer_id);
    pDVar10 = DiagnosticStream::operator<<(&local_208,(char (*) [22])"OpStore Pointer <id> ");
    ValidationState_t::getIdName_abi_cxx11_
              ((string *)&pointer_type,(ValidationState_t *)inst_local,(uint)pointer);
    pDVar10 = DiagnosticStream::operator<<
                        (pDVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&pointer_type);
    pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [27])" is not a logical pointer.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
    std::__cxx11::string::~string((string *)&pointer_type);
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  else {
    AVar3 = ValidationState_t::addressing_model((ValidationState_t *)inst_local);
    if (AVar3 == Logical) {
      pFVar9 = ValidationState_t::features((ValidationState_t *)inst_local);
      if ((pFVar9->variable_pointers & 1U) == 0) {
        OVar4 = Instruction::opcode(local_30);
        iVar5 = spvOpcodeReturnsLogicalPointer(OVar4);
        if (iVar5 == 0) goto LAB_005824a2;
      }
      pFVar9 = ValidationState_t::features((ValidationState_t *)inst_local);
      if ((pFVar9->variable_pointers & 1U) != 0) {
        OVar4 = Instruction::opcode(local_30);
        bVar2 = spvOpcodeReturnsLogicalVariablePointer(OVar4);
        if (!bVar2) goto LAB_005824a2;
      }
    }
    pIVar1 = inst_local;
    uVar6 = Instruction::type_id(local_30);
    local_230 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar6);
    if ((local_230 == (Instruction *)0x0) ||
       ((OVar4 = Instruction::opcode(local_230), OVar4 != OpTypePointer &&
        (OVar4 = Instruction::opcode(local_230), OVar4 != OpTypeUntypedPointerKHR)))) {
      ValidationState_t::diag
                (&local_408,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_pointer_id);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_408,(char (*) [31])"OpStore type for pointer <id> ");
      ValidationState_t::getIdName_abi_cxx11_
                ((string *)&type,(ValidationState_t *)inst_local,(uint)pointer);
      pDVar10 = DiagnosticStream::operator<<
                          (pDVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&type);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [24])0x635df1);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      std::__cxx11::string::~string((string *)&type);
      DiagnosticStream::~DiagnosticStream(&local_408);
    }
    else {
      pIStack_430 = (Instruction *)0x0;
      OVar4 = Instruction::opcode(local_230);
      if (OVar4 == OpTypePointer) {
        local_434 = Instruction::GetOperandAs<unsigned_int>(local_230,2);
        pIStack_430 = ValidationState_t::FindDef((ValidationState_t *)inst_local,local_434);
        if ((pIStack_430 == (Instruction *)0x0) ||
           (OVar4 = Instruction::opcode(pIStack_430), OVar4 == OpTypeVoid)) {
          ValidationState_t::diag
                    (&local_610,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_pointer_id);
          pDVar10 = DiagnosticStream::operator<<(&local_610,(char (*) [22])"OpStore Pointer <id> ");
          ValidationState_t::getIdName_abi_cxx11_
                    ((string *)&storage_class,(ValidationState_t *)inst_local,(uint)pointer);
          pDVar10 = DiagnosticStream::operator<<
                              (pDVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&storage_class);
          pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [16])"s type is void.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
          std::__cxx11::string::~string((string *)&storage_class);
          DiagnosticStream::~DiagnosticStream(&local_610);
          return __local._4_4_;
        }
      }
      pIVar1 = inst_local;
      uVar6 = Instruction::id(local_230);
      bVar2 = ValidationState_t::GetPointerTypeInfo
                        ((ValidationState_t *)pIVar1,uVar6,&local_634,&local_638);
      if (bVar2) {
        if (((local_638 == UniformConstant) || (local_638 == Input)) || (local_638 == PushConstant))
        {
          ValidationState_t::diag
                    (&local_a08,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_pointer_id);
          pDVar10 = DiagnosticStream::operator<<(&local_a08,(char (*) [22])"OpStore Pointer <id> ");
          ValidationState_t::getIdName_abi_cxx11_
                    (&local_a28,(ValidationState_t *)inst_local,(uint)pointer);
          pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_a28);
          pDVar10 = DiagnosticStream::operator<<
                              (pDVar10,(char (*) [28])" storage class is read-only");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
          std::__cxx11::string::~string((string *)&local_a28);
          DiagnosticStream::~DiagnosticStream(&local_a08);
        }
        else if (local_638 == ShaderRecordBufferKHR) {
          ValidationState_t::diag
                    ((DiagnosticStream *)((long)&errorVUID.field_2 + 8),
                     (ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_pointer_id);
          pDVar10 = DiagnosticStream::operator<<
                              ((DiagnosticStream *)((long)&errorVUID.field_2 + 8),
                               (char (*) [60])
                               "ShaderRecordBufferKHR Storage Class variables are read only");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)((long)&errorVUID.field_2 + 8));
        }
        else {
          if (local_638 == HitAttributeKHR) {
            ValidationState_t::VkErrorID_abi_cxx11_
                      ((string *)local_c20,(ValidationState_t *)inst_local,0x125f,(char *)0x0);
            pIVar1 = inst_local;
            pFVar11 = Instruction::function(_pointer_id);
            uVar6 = Function::id(pFVar11);
            pFVar11 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar6);
            std::__cxx11::string::string((string *)&base_ptr,(string *)local_c20);
            std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
            function<spvtools::val::(anonymous_namespace)::ValidateStore(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__0,void>
                      ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_c40,
                       (anon_class_32_1_293d74c2 *)&base_ptr);
            Function::RegisterExecutionModelLimitation(pFVar11,&local_c40);
            std::
            function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
            ::~function(&local_c40);
            (anonymous_namespace)::
            ValidateStore(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0
            ::~__0((__0 *)&base_ptr);
            std::__cxx11::string::~string((string *)local_c20);
          }
          psVar12 = ValidationState_t::context((ValidationState_t *)inst_local);
          bVar2 = spvIsVulkanEnv(psVar12->target_env);
          if ((bVar2) && (local_638 == Uniform)) {
            base_type = ValidationState_t::TracePointer((ValidationState_t *)inst_local,local_30);
            OVar4 = Instruction::opcode(base_type);
            pIVar1 = inst_local;
            if (OVar4 == OpVariable) {
              uVar7 = Instruction::GetOperandAs<unsigned_int>(base_type,0);
              local_c70 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar7);
              pIVar1 = inst_local;
              uVar7 = Instruction::GetOperandAs<unsigned_int>(local_c70,2);
              local_c70 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar7);
              OVar4 = Instruction::opcode(local_c70);
              if ((OVar4 == OpTypeArray) ||
                 (OVar4 = Instruction::opcode(local_c70), OVar4 == OpTypeRuntimeArray)) {
                pIVar1 = inst_local;
                uVar7 = Instruction::GetOperandAs<unsigned_int>(local_c70,1);
                local_c70 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar7);
              }
              pIVar1 = inst_local;
              uVar6 = Instruction::id(local_c70);
              bVar2 = ValidationState_t::HasDecoration((ValidationState_t *)pIVar1,uVar6,Block);
              if (bVar2) {
                ValidationState_t::diag
                          (&local_e48,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                           _pointer_id);
                ValidationState_t::VkErrorID_abi_cxx11_
                          ((string *)&object_id,(ValidationState_t *)inst_local,0x1b0d,(char *)0x0);
                pDVar10 = DiagnosticStream::operator<<
                                    (&local_e48,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&object_id);
                pDVar10 = DiagnosticStream::operator<<
                                    (pDVar10,(char (*) [58])
                                             "In the Vulkan environment, cannot store to Uniform Blocks"
                                    );
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
                std::__cxx11::string::~string((string *)&object_id);
                DiagnosticStream::~DiagnosticStream(&local_e48);
                return __local._4_4_;
              }
            }
          }
          object._4_4_ = 1;
          object._0_4_ = Instruction::GetOperandAs<unsigned_int>(_pointer_id,1);
          local_e78 = ValidationState_t::FindDef((ValidationState_t *)inst_local,(uint)object);
          if ((local_e78 == (Instruction *)0x0) ||
             (uVar6 = Instruction::type_id(local_e78), pIVar1 = inst_local, uVar6 == 0)) {
            ValidationState_t::diag
                      (&local_1050,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_pointer_id)
            ;
            pDVar10 = DiagnosticStream::operator<<
                                (&local_1050,(char (*) [21])"OpStore Object <id> ");
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&object_type,(ValidationState_t *)inst_local,(uint)object);
            pDVar10 = DiagnosticStream::operator<<
                                (pDVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&object_type);
            pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [19])" is not an object.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            std::__cxx11::string::~string((string *)&object_type);
            DiagnosticStream::~DiagnosticStream(&local_1050);
          }
          else {
            uVar6 = Instruction::type_id(local_e78);
            local_1078 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar6);
            if ((local_1078 == (Instruction *)0x0) ||
               (OVar4 = Instruction::opcode(local_1078), OVar4 == OpTypeVoid)) {
              ValidationState_t::diag
                        (&local_1250,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                         _pointer_id);
              pDVar10 = DiagnosticStream::operator<<
                                  (&local_1250,(char (*) [21])"OpStore Object <id> ");
              ValidationState_t::getIdName_abi_cxx11_
                        (&local_1270,(ValidationState_t *)inst_local,(uint)object);
              pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_1270);
              pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [16])"s type is void.");
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
              std::__cxx11::string::~string((string *)&local_1270);
              DiagnosticStream::~DiagnosticStream(&local_1250);
            }
            else {
              if (pIStack_430 != (Instruction *)0x0) {
                uVar6 = Instruction::id(pIStack_430);
                uVar8 = Instruction::id(local_1078);
                if (uVar6 != uVar8) {
                  psVar13 = ValidationState_t::options((ValidationState_t *)inst_local);
                  if ((((psVar13->relax_struct_store & 1U) == 0) ||
                      (OVar4 = Instruction::opcode(pIStack_430), OVar4 != OpTypeStruct)) ||
                     (OVar4 = Instruction::opcode(local_1078), OVar4 != OpTypeStruct)) {
                    ValidationState_t::diag
                              (&local_1448,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                               _pointer_id);
                    pDVar10 = DiagnosticStream::operator<<
                                        (&local_1448,(char (*) [22])"OpStore Pointer <id> ");
                    ValidationState_t::getIdName_abi_cxx11_
                              (&local_1468,(ValidationState_t *)inst_local,(uint)pointer);
                    pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_1468);
                    pDVar10 = DiagnosticStream::operator<<
                                        (pDVar10,(char (*) [35])"s type does not match Object <id> "
                                        );
                    pIVar1 = inst_local;
                    uVar6 = Instruction::id(local_e78);
                    ValidationState_t::getIdName_abi_cxx11_
                              (&local_1488,(ValidationState_t *)pIVar1,uVar6);
                    pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_1488);
                    pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [8])"s type.");
                    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
                    std::__cxx11::string::~string((string *)&local_1488);
                    std::__cxx11::string::~string((string *)&local_1468);
                    DiagnosticStream::~DiagnosticStream(&local_1448);
                    return __local._4_4_;
                  }
                  bVar2 = AreLayoutCompatibleStructs
                                    ((ValidationState_t *)inst_local,pIStack_430,local_1078);
                  if (!bVar2) {
                    ValidationState_t::diag
                              (&local_1660,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                               _pointer_id);
                    pDVar10 = DiagnosticStream::operator<<
                                        (&local_1660,(char (*) [22])"OpStore Pointer <id> ");
                    ValidationState_t::getIdName_abi_cxx11_
                              (&local_1680,(ValidationState_t *)inst_local,(uint)pointer);
                    pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_1680);
                    pDVar10 = DiagnosticStream::operator<<
                                        (pDVar10,(char (*) [37])
                                                 "s layout does not match Object <id> ");
                    pIVar1 = inst_local;
                    uVar6 = Instruction::id(local_e78);
                    ValidationState_t::getIdName_abi_cxx11_
                              ((string *)local_16a0,(ValidationState_t *)pIVar1,uVar6);
                    pDVar10 = DiagnosticStream::operator<<
                                        (pDVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_16a0);
                    pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [10])"s layout.");
                    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
                    std::__cxx11::string::~string((string *)local_16a0);
                    std::__cxx11::string::~string((string *)&local_1680);
                    DiagnosticStream::~DiagnosticStream(&local_1660);
                    return __local._4_4_;
                  }
                }
              }
              local_16a4 = CheckMemoryAccess((ValidationState_t *)inst_local,_pointer_id,2);
              __local._4_4_ = local_16a4;
              if (local_16a4 == SPV_SUCCESS) {
                bVar2 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,Shader);
                pIVar1 = inst_local;
                if (bVar2) {
                  uVar6 = Instruction::type_id(_pointer_id);
                  bVar2 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                    ((ValidationState_t *)pIVar1,uVar6);
                  if ((((bVar2) && (OVar4 = Instruction::opcode(local_1078), OVar4 != OpTypePointer)
                       ) && ((OVar4 = Instruction::opcode(local_1078), OVar4 != OpTypeInt &&
                             ((OVar4 = Instruction::opcode(local_1078), OVar4 != OpTypeFloat &&
                              (OVar4 = Instruction::opcode(local_1078), OVar4 != OpTypeVector))))))
                     && (OVar4 = Instruction::opcode(local_1078), OVar4 != OpTypeMatrix)) {
                    ValidationState_t::diag
                              (&local_1880,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                               _pointer_id);
                    pDVar10 = DiagnosticStream::operator<<
                                        (&local_1880,
                                         (char (*) [60])
                                         "8- or 16-bit stores must be a scalar, vector or matrix type"
                                        );
                    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
                    DiagnosticStream::~DiagnosticStream(&local_1880);
                    return __local._4_4_;
                  }
                }
                __local._4_4_ = SPV_SUCCESS;
              }
            }
          }
        }
      }
      else {
        ValidationState_t::diag
                  (&local_810,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_pointer_id);
        pDVar10 = DiagnosticStream::operator<<(&local_810,(char (*) [22])"OpStore Pointer <id> ");
        ValidationState_t::getIdName_abi_cxx11_
                  (&local_830,(ValidationState_t *)inst_local,(uint)pointer);
        pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_830);
        pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [21])" is not pointer type");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
        std::__cxx11::string::~string((string *)&local_830);
        DiagnosticStream::~DiagnosticStream(&local_810);
      }
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateStore(ValidationState_t& _, const Instruction* inst) {
  const auto pointer_index = 0;
  const auto pointer_id = inst->GetOperandAs<uint32_t>(pointer_index);
  const auto pointer = _.FindDef(pointer_id);
  if (!pointer ||
      (_.addressing_model() == spv::AddressingModel::Logical &&
       ((!_.features().variable_pointers &&
         !spvOpcodeReturnsLogicalPointer(pointer->opcode())) ||
        (_.features().variable_pointers &&
         !spvOpcodeReturnsLogicalVariablePointer(pointer->opcode()))))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpStore Pointer <id> " << _.getIdName(pointer_id)
           << " is not a logical pointer.";
  }
  const auto pointer_type = _.FindDef(pointer->type_id());
  if (!pointer_type ||
      (pointer_type->opcode() != spv::Op::OpTypePointer &&
       pointer_type->opcode() != spv::Op::OpTypeUntypedPointerKHR)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpStore type for pointer <id> " << _.getIdName(pointer_id)
           << " is not a pointer type.";
  }

  Instruction* type = nullptr;
  if (pointer_type->opcode() == spv::Op::OpTypePointer) {
    const auto type_id = pointer_type->GetOperandAs<uint32_t>(2);
    type = _.FindDef(type_id);
    if (!type || spv::Op::OpTypeVoid == type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "OpStore Pointer <id> " << _.getIdName(pointer_id)
             << "s type is void.";
    }
  }

  // validate storage class
  {
    uint32_t data_type;
    spv::StorageClass storage_class;
    if (!_.GetPointerTypeInfo(pointer_type->id(), &data_type, &storage_class)) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "OpStore Pointer <id> " << _.getIdName(pointer_id)
             << " is not pointer type";
    }

    if (storage_class == spv::StorageClass::UniformConstant ||
        storage_class == spv::StorageClass::Input ||
        storage_class == spv::StorageClass::PushConstant) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "OpStore Pointer <id> " << _.getIdName(pointer_id)
             << " storage class is read-only";
    } else if (storage_class == spv::StorageClass::ShaderRecordBufferKHR) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "ShaderRecordBufferKHR Storage Class variables are read only";
    } else if (storage_class == spv::StorageClass::HitAttributeKHR) {
      std::string errorVUID = _.VkErrorID(4703);
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [errorVUID](spv::ExecutionModel model, std::string* message) {
                if (model == spv::ExecutionModel::AnyHitKHR ||
                    model == spv::ExecutionModel::ClosestHitKHR) {
                  if (message) {
                    *message =
                        errorVUID +
                        "HitAttributeKHR Storage Class variables are read only "
                        "with AnyHitKHR and ClosestHitKHR";
                  }
                  return false;
                }
                return true;
              });
    }

    if (spvIsVulkanEnv(_.context()->target_env) &&
        storage_class == spv::StorageClass::Uniform) {
      auto base_ptr = _.TracePointer(pointer);
      if (base_ptr->opcode() == spv::Op::OpVariable) {
        // If it's not a variable a different check should catch the problem.
        auto base_type = _.FindDef(base_ptr->GetOperandAs<uint32_t>(0));
        // Get the pointed-to type.
        base_type = _.FindDef(base_type->GetOperandAs<uint32_t>(2u));
        if (base_type->opcode() == spv::Op::OpTypeArray ||
            base_type->opcode() == spv::Op::OpTypeRuntimeArray) {
          base_type = _.FindDef(base_type->GetOperandAs<uint32_t>(1u));
        }
        if (_.HasDecoration(base_type->id(), spv::Decoration::Block)) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << _.VkErrorID(6925)
                 << "In the Vulkan environment, cannot store to Uniform Blocks";
        }
      }
    }
  }

  const auto object_index = 1;
  const auto object_id = inst->GetOperandAs<uint32_t>(object_index);
  const auto object = _.FindDef(object_id);
  if (!object || !object->type_id()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpStore Object <id> " << _.getIdName(object_id)
           << " is not an object.";
  }
  const auto object_type = _.FindDef(object->type_id());
  if (!object_type || spv::Op::OpTypeVoid == object_type->opcode()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpStore Object <id> " << _.getIdName(object_id)
           << "s type is void.";
  }

  if (type && (type->id() != object_type->id())) {
    if (!_.options()->relax_struct_store ||
        type->opcode() != spv::Op::OpTypeStruct ||
        object_type->opcode() != spv::Op::OpTypeStruct) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "OpStore Pointer <id> " << _.getIdName(pointer_id)
             << "s type does not match Object <id> "
             << _.getIdName(object->id()) << "s type.";
    }

    // TODO: Check for layout compatible matricies and arrays as well.
    if (!AreLayoutCompatibleStructs(_, type, object_type)) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "OpStore Pointer <id> " << _.getIdName(pointer_id)
             << "s layout does not match Object <id> "
             << _.getIdName(object->id()) << "s layout.";
    }
  }

  if (auto error = CheckMemoryAccess(_, inst, 2)) return error;

  if (_.HasCapability(spv::Capability::Shader) &&
      _.ContainsLimitedUseIntOrFloatType(inst->type_id()) &&
      object_type->opcode() != spv::Op::OpTypePointer) {
    if (object_type->opcode() != spv::Op::OpTypeInt &&
        object_type->opcode() != spv::Op::OpTypeFloat &&
        object_type->opcode() != spv::Op::OpTypeVector &&
        object_type->opcode() != spv::Op::OpTypeMatrix) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "8- or 16-bit stores must be a scalar, vector or matrix type";
    }
  }

  return SPV_SUCCESS;
}